

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_clone(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  short sVar2;
  int min_level;
  char *pcVar3;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar4;
  CHAR_DATA *clone;
  OBJ_DATA *pOVar5;
  OBJ_DATA **ppOVar6;
  char arg [4608];
  char buf [4608];
  
  pcVar3 = one_argument(argument,arg);
  if (arg[0] == '\0') {
    pcVar3 = "Clone what?\n\r";
    goto LAB_002cb217;
  }
  bVar1 = str_prefix(arg,"object");
  if (bVar1) {
    bVar1 = str_prefix(arg,"mobile");
    if ((bVar1) && (bVar1 = str_prefix(arg,"character"), bVar1)) {
      ch_00 = get_char_room(ch,argument);
      pOVar4 = get_obj_here(ch,argument);
      if (ch_00 == (CHAR_DATA *)0x0 && pOVar4 == (OBJ_DATA *)0x0) {
LAB_002cb1fe:
        pcVar3 = "You don\'t see that here.\n\r";
        goto LAB_002cb217;
      }
      if (pOVar4 != (OBJ_DATA *)0x0) goto LAB_002cb078;
      if (ch_00 == (CHAR_DATA *)0x0) {
        return;
      }
    }
    else {
      ch_00 = get_char_room(ch,pcVar3);
      if (ch_00 == (CHAR_DATA *)0x0) goto LAB_002cb1fe;
    }
    bVar1 = is_npc(ch_00);
    if (!bVar1) {
      pcVar3 = "You can only clone mobiles.\n\r";
      goto LAB_002cb217;
    }
    sVar2 = ch_00->level;
    if (0x14 < sVar2) {
      bVar1 = is_trusted(ch,0x38);
      if (!bVar1) goto LAB_002cb207;
      sVar2 = ch_00->level;
    }
    if (10 < sVar2) {
      bVar1 = is_trusted(ch,0x37);
      if (!bVar1) goto LAB_002cb207;
      sVar2 = ch_00->level;
    }
    if (5 < sVar2) {
      bVar1 = is_trusted(ch,0x36);
      if (!bVar1) goto LAB_002cb207;
      sVar2 = ch_00->level;
    }
    if (((sVar2 < 1) || (bVar1 = is_trusted(ch,0x35), bVar1)) &&
       (bVar1 = is_trusted(ch,0x34), bVar1)) {
      clone = create_mobile(ch_00->pIndexData);
      clone_mobile(ch_00,clone);
      ppOVar6 = &ch_00->carrying;
      while (pOVar4 = *ppOVar6, pOVar4 != (OBJ_DATA *)0x0) {
        bVar1 = obj_check(ch,pOVar4);
        if (bVar1) {
          pOVar5 = create_object(pOVar4->pIndexData,0);
          clone_object(pOVar4,pOVar5);
          recursive_clone(ch,pOVar4,pOVar5);
          obj_to_char(pOVar5,clone);
          pOVar5->wear_loc = pOVar4->wear_loc;
        }
        ppOVar6 = &pOVar4->next_content;
      }
      char_to_room(clone,ch->in_room);
      act("$n has created $N.",ch,(void *)0x0,clone,0);
      act("You clone $N.",ch,(void *)0x0,clone,3);
      pcVar3 = buf;
      sprintf(pcVar3,"$N clones %s.",clone->short_descr);
      min_level = get_trust(ch);
      pOVar5 = (OBJ_DATA *)0x0;
LAB_002cb296:
      wiznet(pcVar3,ch,pOVar5,0x10,0xc,min_level);
      return;
    }
  }
  else {
    pOVar4 = get_obj_here(ch,pcVar3);
    if (pOVar4 == (OBJ_DATA *)0x0) goto LAB_002cb1fe;
LAB_002cb078:
    bVar1 = obj_check(ch,pOVar4);
    if (bVar1) {
      pOVar5 = create_object(pOVar4->pIndexData,0);
      clone_object(pOVar4,pOVar5);
      if (pOVar4->carried_by == (CHAR_DATA *)0x0) {
        obj_to_room(pOVar5,ch->in_room);
      }
      else {
        obj_to_char(pOVar5,ch);
      }
      recursive_clone(ch,pOVar4,pOVar5);
      act("$n has created $p.",ch,pOVar5,(void *)0x0,0);
      act("You clone $p.",ch,pOVar5,(void *)0x0,3);
      min_level = get_trust(ch);
      pcVar3 = "$N clones $p.";
      goto LAB_002cb296;
    }
  }
LAB_002cb207:
  pcVar3 = "Your powers are not great enough for such a task.\n\r";
LAB_002cb217:
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_clone(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *rest;
	CHAR_DATA *mob;
	OBJ_DATA *obj;

	rest = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Clone what?\n\r", ch);
		return;
	}

	if (!str_prefix(arg, "object"))
	{
		mob = nullptr;
		obj = get_obj_here(ch, rest);

		if (obj == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg, "mobile") || !str_prefix(arg, "character"))
	{
		obj = nullptr;
		mob = get_char_room(ch, rest);

		if (mob == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}
	else /* find both */
	{
		mob = get_char_room(ch, argument);
		obj = get_obj_here(ch, argument);
		if (mob == nullptr && obj == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}

	/* clone an object */
	if (obj != nullptr)
	{
		OBJ_DATA *clone;

		if (!obj_check(ch, obj))
		{
			send_to_char("Your powers are not great enough for such a task.\n\r", ch);
			return;
		}

		clone = create_object(obj->pIndexData, 0);
		clone_object(obj, clone);

		if (obj->carried_by != nullptr)
			obj_to_char(clone, ch);
		else
			obj_to_room(clone, ch->in_room);

		recursive_clone(ch, obj, clone);

		act("$n has created $p.", ch, clone, nullptr, TO_ROOM);
		act("You clone $p.", ch, clone, nullptr, TO_CHAR);

		wiznet("$N clones $p.", ch, clone, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	}
	else if (mob != nullptr)
	{
		CHAR_DATA *clone;
		OBJ_DATA *new_obj;
		char buf[MAX_STRING_LENGTH];

		if (!is_npc(mob))
		{
			send_to_char("You can only clone mobiles.\n\r", ch);
			return;
		}

		if ((mob->level > 20 && !is_trusted(ch, GOD))
			|| (mob->level > 10 && !is_trusted(ch, IMMORTAL))
			|| (mob->level > 5 && !is_trusted(ch, DEMI))
			|| (mob->level > 0 && !is_trusted(ch, ANGEL))
			|| !is_trusted(ch, AVATAR))
		{
			send_to_char("Your powers are not great enough for such a task.\n\r", ch);
			return;
		}

		clone = create_mobile(mob->pIndexData);
		clone_mobile(mob, clone);

		for (obj = mob->carrying; obj != nullptr; obj = obj->next_content)
		{
			if (obj_check(ch, obj))
			{
				new_obj = create_object(obj->pIndexData, 0);
				clone_object(obj, new_obj);
				recursive_clone(ch, obj, new_obj);
				obj_to_char(new_obj, clone);
				new_obj->wear_loc = obj->wear_loc;
			}
		}

		char_to_room(clone, ch->in_room);

		act("$n has created $N.", ch, nullptr, clone, TO_ROOM);
		act("You clone $N.", ch, nullptr, clone, TO_CHAR);

		sprintf(buf, "$N clones %s.", clone->short_descr);
		wiznet(buf, ch, nullptr, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	}
}